

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void abort_write_jobs(cio_websocket *websocket)

{
  cio_websocket_write_job *pcVar1;
  cio_websocket_write_job *pcVar2;
  
  pcVar1 = (websocket->ws_private).first_write_job;
  while( true ) {
    if (pcVar1 == (cio_websocket_write_job *)0x0) {
      pcVar1 = (cio_websocket_write_job *)0x0;
    }
    else {
      if (pcVar1 == (websocket->ws_private).last_write_job) {
        pcVar2 = (cio_websocket_write_job *)0x0;
      }
      else {
        pcVar2 = pcVar1->next;
      }
      (websocket->ws_private).first_write_job = pcVar2;
    }
    if (pcVar1 == (cio_websocket_write_job *)0x0) break;
    pcVar1->wbh = (cio_write_buffer *)0x0;
    if (pcVar1->handler != (cio_websocket_write_handler_t)0x0) {
      (*pcVar1->handler)(websocket,pcVar1->handler_context,CIO_OPERATION_ABORTED);
    }
    pcVar1 = (websocket->ws_private).first_write_job;
  }
  return;
}

Assistant:

static void abort_write_jobs(struct cio_websocket *websocket)
{
	struct cio_websocket_write_job *job = dequeue_job(websocket);

	while (job != NULL) {
		job->wbh = NULL;
		if (job->handler) {
			job->handler(websocket, job->handler_context, CIO_OPERATION_ABORTED);
		}

		job = dequeue_job(websocket);
	}
}